

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

int buffer_pread(int fd,char *s,uint len)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  uint local_20;
  uint local_1c;
  int i;
  uint len_local;
  char *s_local;
  int fd_local;
  
  for (local_20 = 0; local_20 < dirn; local_20 = local_20 + 1) {
    buffer_flush(&dir[(int)local_20].b);
  }
  if (rotateasap != 0) {
    for (local_20 = 0; local_20 < dirn; local_20 = local_20 + 1) {
      rotate(dir + (int)local_20);
    }
    rotateasap = 0;
  }
  local_1c = len;
  if (exitasap != 0) {
    if (linecomplete != 0) {
      return 0;
    }
    local_1c = 1;
  }
  if (reopenasap != 0) {
    logdirs_reopen();
    reopenasap = 0;
  }
  taia_now(&now);
  taia_uint(&trotate,0xab8);
  taia_add(&trotate,&now,&trotate);
  for (local_20 = 0; local_20 < dirn; local_20 = local_20 + 1) {
    if (dir[(int)local_20].tmax != 0) {
      iVar2 = taia_less(&dir[(int)local_20].trotate,&now);
      if (iVar2 != 0) {
        rotate(dir + (int)local_20);
      }
      iVar2 = taia_less(&dir[(int)local_20].trotate,&trotate);
      if (iVar2 != 0) {
        trotate.sec.x = dir[(int)local_20].trotate.sec.x;
        trotate.nano = dir[(int)local_20].trotate.nano;
        trotate.atto = dir[(int)local_20].trotate.atto;
      }
    }
  }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in,1,&trotate,&now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sVar3 = read(fd,s,(ulong)local_1c);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar1 = error_intr;
    if (*piVar4 == error_again) {
      piVar4 = __errno_location();
      *piVar4 = iVar1;
    }
    piVar4 = __errno_location();
    if (*piVar4 != error_intr) {
      warn("unable to read standard input");
    }
  }
  if (0 < iVar2) {
    linecomplete = (uint)(s[iVar2 + -1] == '\n');
  }
  return iVar2;
}

Assistant:

int buffer_pread(int fd, char *s, unsigned int len) {
  int i;

  for (i =0; i < dirn; ++i) buffer_flush(&dir[i].b);
  if (rotateasap) {
    for (i =0; i < dirn; ++i) rotate(dir +i);
    rotateasap =0;
  }
  if (exitasap) {
    if (linecomplete) return(0);
    len =1;
  }
  if (reopenasap) {
    logdirs_reopen();
    reopenasap =0;
  }
  taia_now(&now);
  taia_uint(&trotate, 2744);
  taia_add(&trotate, &now, &trotate);
  for (i =0; i < dirn; ++i)
    if ((dir +i)->tmax) {
      if (taia_less(&dir[i].trotate, &now)) rotate(dir +i);
      if (taia_less(&dir[i].trotate, &trotate)) trotate =dir[i].trotate;
    }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in, 1, &trotate, &now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  i =read(fd, s, len);
  if (i == -1) {
    if (errno == error_again) errno =error_intr;
    if (errno != error_intr) warn("unable to read standard input");
  }
  if (i > 0) linecomplete =(s[i -1] == '\n');
  return(i);
}